

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::ExternalCommand::execute
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  _Any_data *p_Var1;
  pointer ppBVar2;
  size_type sVar3;
  _Manager_type p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  BuildSystemDelegate *pBVar9;
  FileSystem *pFVar10;
  pointer pcVar11;
  pointer pcVar12;
  pointer pcVar13;
  BuildNode *pBVar14;
  pointer ppBVar15;
  char *pcVar16;
  StringRef path;
  StringRef SVar17;
  BuildValue result;
  undefined1 local_c8 [112];
  undefined8 *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  char local_38;
  
  pcVar11 = (pointer)ti.ctx;
  pcVar13 = (pointer)ti.impl;
  if ((this->skipValue).Storage.hasVal == true) {
    bVar8 = 1;
    if ((this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
        super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
        super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
        Size != 0) {
      pBVar9 = BuildSystem::getDelegate(system);
      ppBVar15 = (this->super_Command).outputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppBVar15 ==
          (this->super_Command).outputs.
          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar14 = (BuildNode *)0x0;
      }
      else {
        pBVar14 = *ppBVar15;
      }
      (*pBVar9->_vptr_BuildSystemDelegate[0x10])
                (pBVar9,this,pBVar14,
                 (this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
                 super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                 super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                 super_SmallVectorBase.BeginX,
                 (ulong)(this->missingInputKeys).
                        super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
                        super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                        super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                        super_SmallVectorBase.Size);
      pBVar9 = BuildSystem::getDelegate(system);
      (*pBVar9->_vptr_BuildSystemDelegate[6])(pBVar9);
      bVar8 = (this->skipValue).Storage.hasVal;
    }
    if ((bVar8 & 1) == 0) {
      __assert_fail("Storage.hasVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                    ,0xb0,
                    "T *llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer() [T = llbuild::buildsystem::BuildValue]"
                   );
    }
    if ((resultFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*resultFn->_M_invoker)((_Any_data *)resultFn,(BuildValue *)&this->skipValue);
      return;
    }
LAB_00177209:
    std::__throw_bad_function_call();
  }
  if ((this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
      super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      Size != 0) {
    __assert_fail("missingInputKeys.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                  ,0x189,
                  "virtual void llbuild::buildsystem::ExternalCommand::execute(BuildSystem &, core::TaskInterface, QueueJobContext *, ResultFn)"
                 );
  }
  pcVar12 = pcVar11;
  if ((this->canUpdateIfNewer == true) && (this->hasPriorResult == true)) {
    pcVar12 = pcVar13;
    (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1b])
              ((BuildValue *)local_c8,this,system,pcVar13,pcVar11);
    bVar7 = canUpdateIfNewerWithResult(this,(BuildValue *)local_c8);
    if (bVar7) {
      if ((resultFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*resultFn->_M_invoker)((_Any_data *)resultFn,(BuildValue *)local_c8);
        BuildValue::~BuildValue((BuildValue *)local_c8);
        return;
      }
      goto LAB_00177209;
    }
    BuildValue::~BuildValue((BuildValue *)local_c8);
  }
  ppBVar15 = (this->super_Command).outputs.
             super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar15 != ppBVar2) {
    do {
      pBVar14 = *ppBVar15;
      if (pBVar14->type != Virtual) {
        SVar17.Length = 2;
        SVar17.Data = (char *)(pBVar14->super_Node).name._M_string_length;
        SVar17 = llvm::sys::path::parent_path
                           ((path *)(pBVar14->super_Node).name._M_dataplus._M_p,SVar17,
                            (Style)pcVar12);
        sVar3 = (pBVar14->super_Node).name._M_string_length;
        if ((sVar3 != 0) &&
           (pcVar12 = (pBVar14->super_Node).name._M_dataplus._M_p, pcVar12[sVar3 - 1] == '/')) {
          path.Length = 2;
          path.Data = (char *)SVar17.Length;
          SVar17 = llvm::sys::path::parent_path((path *)SVar17.Data,path,(Style)pcVar12);
        }
        pcVar16 = SVar17.Data;
        if (SVar17.Length != 0) {
          pFVar10 = BuildSystem::getFileSystem(system);
          local_c8._0_8_ = local_c8 + 0x10;
          if (pcVar16 == (char *)0x0) {
            local_c8._8_8_ = 0;
            local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,pcVar16,pcVar16 + SVar17.Length);
          }
          (*pFVar10->_vptr_FileSystem[3])(pFVar10,(string *)local_c8);
          if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
            operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
          }
        }
      }
      ppBVar15 = ppBVar15 + 1;
    } while (ppBVar15 != ppBVar2);
  }
  pBVar9 = BuildSystem::getDelegate(system);
  (*pBVar9->_vptr_BuildSystemDelegate[10])(pBVar9,this);
  p_Var1 = (_Any_data *)(local_c8 + 0x20);
  local_c8._32_8_ = 0;
  local_c8._40_8_ = 0;
  local_c8._48_8_ = (_Manager_type)0x0;
  local_c8._56_8_ = (_Invoker_type)0x0;
  p_Var4 = (resultFn->super__Function_base)._M_manager;
  local_c8._0_8_ = this;
  local_c8._8_8_ = system;
  local_c8._16_8_ = pcVar13;
  local_c8._24_8_ = pcVar11;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)(p_Var1,(_Any_data *)resultFn,__clone_functor);
    local_c8._56_8_ = resultFn->_M_invoker;
    local_c8._48_8_ = (resultFn->super__Function_base)._M_manager;
  }
  uVar6 = local_c8._56_8_;
  uVar5 = local_c8._48_8_;
  local_58 = (undefined8 *)operator_new(0x40);
  *local_58 = local_c8._0_8_;
  local_58[1] = local_c8._8_8_;
  *(undefined4 *)(local_58 + 2) = local_c8._16_4_;
  *(undefined4 *)((long)local_58 + 0x14) = local_c8._20_4_;
  *(undefined4 *)(local_58 + 3) = local_c8._24_4_;
  *(undefined4 *)((long)local_58 + 0x1c) = local_c8._28_4_;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = uVar6;
  if ((_Manager_type)uVar5 != (_Manager_type)0x0) {
    local_58[4] = local_c8._32_8_;
    local_58[5] = local_c8._40_8_;
    local_58[6] = uVar5;
    local_c8._48_8_ = (_Manager_type)0x0;
    local_c8._56_8_ = (_Invoker_type)0x0;
  }
  local_38 = '\x01';
  local_40 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp:426:48)>
             ::_M_invoke;
  local_50 = 0;
  local_48 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp:426:48)>
             ::_M_manager;
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x1a])
            (this,system,pcVar13,pcVar11,context,&local_58);
  if (local_38 == '\x01') {
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    local_38 = '\0';
  }
  if ((_Manager_type)local_c8._48_8_ != (_Manager_type)0x0) {
    (*(code *)local_c8._48_8_)(p_Var1,p_Var1,3);
  }
  return;
}

Assistant:

void ExternalCommand::execute(BuildSystem& system,
                              core::TaskInterface ti,
                              QueueJobContext* context,
                              ResultFn resultFn) {
  // If this command should be skipped, do nothing.
  if (skipValue.hasValue()) {
    // If this command had a failed input, treat it as having failed.
    if (!missingInputKeys.empty()) {
      system.getDelegate().commandCannotBuildOutputDueToMissingInputs(this,
                         outputs.empty() ? nullptr : outputs[0], missingInputKeys);

      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }

    resultFn(std::move(skipValue.getValue()));
    return;
  }
  assert(missingInputKeys.empty());

  // If it is legal to simply update the command, then see if we can do so.
  if (canUpdateIfNewer && hasPriorResult) {
    BuildValue result = computeCommandResult(system, ti);
    if (canUpdateIfNewerWithResult(result)) {
      resultFn(std::move(result));
      return;
    }
  }

  // Create the directories for the directories containing file outputs.
  //
  // FIXME: Implement a shared cache for this, to reduce the number of
  // syscalls required to make this happen.
  for (auto* node: outputs) {
    if (!node->isVirtual()) {
      // Attempt to create the directory; we ignore errors here under the
      // assumption the command will diagnose the situation if necessary.
      //
      // FIXME: Need to use the filesystem interfaces.
      auto parent = llvm::sys::path::parent_path(node->getName());
      if (node->getName().endswith("/")) {
        parent = llvm::sys::path::parent_path(parent);
      }
      if (!parent.empty()) {
        (void) system.getFileSystem().createDirectories(parent);
      }
    }
  }
    
  // Invoke the external command.
  system.getDelegate().commandStarted(this);
  executeExternalCommand(system, ti, context, {[this, &system, ti, resultFn](ProcessResult result) mutable {
    system.getDelegate().commandFinished(this, result.status);

    // Process the result.
    switch (result.status) {
    case ProcessStatus::Failed:
      resultFn(BuildValue::makeFailedCommand());
      return;
    case ProcessStatus::Cancelled:
      resultFn(BuildValue::makeCancelledCommand());
      return;
    case ProcessStatus::Succeeded:
      resultFn(computeCommandResult(system, ti));
      return;
    case ProcessStatus::Skipped:
    case ProcessStatus::Unknown:
      // It is illegal to get skipped result at this point.
      break;
    }
    llvm::report_fatal_error("unknown result");
  }});
}